

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjtalk.c
# Opt level: O1

void Open_JTalk_clear(Open_JTalk *open_jtalk)

{
  if (open_jtalk != (Open_JTalk *)0x0) {
    Mecab_clear(&open_jtalk->mecab);
    NJD_clear(&open_jtalk->njd);
    JPCommon_clear(&open_jtalk->jpcommon);
    HTS_Engine_clear(&open_jtalk->engine);
    return;
  }
  return;
}

Assistant:

void Open_JTalk_clear(Open_JTalk *open_jtalk)
{
	if (open_jtalk == NULL)
	{
		return;
	}
	Mecab_clear(&open_jtalk->mecab);
	NJD_clear(&open_jtalk->njd);
	JPCommon_clear(&open_jtalk->jpcommon);
	HTS_Engine_clear(&open_jtalk->engine);
}